

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::ScopedPrematureExitFile::ScopedPrematureExitFile
          (ScopedPrematureExitFile *this,char *premature_exit_filepath)

{
  ulong uVar1;
  char *path;
  FILE *__s;
  char *local_48;
  FILE *pfile;
  allocator local_19;
  char *local_18;
  char *premature_exit_filepath_local;
  ScopedPrematureExitFile *this_local;
  
  local_48 = premature_exit_filepath;
  if (premature_exit_filepath == (char *)0x0) {
    local_48 = "";
  }
  local_18 = premature_exit_filepath;
  premature_exit_filepath_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,local_48,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    path = (char *)std::__cxx11::string::c_str();
    __s = (FILE *)posix::FOpen(path,"w");
    fwrite("0",1,1,__s);
    fclose(__s);
  }
  return;
}

Assistant:

explicit ScopedPrematureExitFile(const char* premature_exit_filepath)
      : premature_exit_filepath_(
            premature_exit_filepath ? premature_exit_filepath : "") {
    // If a path to the premature-exit file is specified...
    if (!premature_exit_filepath_.empty()) {
      // create the file with a single "0" character in it.  I/O
      // errors are ignored as there's nothing better we can do and we
      // don't want to fail the test because of this.
      FILE* pfile = posix::FOpen(premature_exit_filepath_.c_str(), "w");
      fwrite("0", 1, 1, pfile);
      fclose(pfile);
    }
  }